

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

bool AdjustPolyCurve(ON_PolyCurve *crv,ON_3dPoint *P0,ON_3dPoint *P1)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ON_Curve *pOVar5;
  ON_3dPoint *pOVar6;
  ON_3dPoint *P1_00;
  byte local_103;
  ON_3dPoint local_f0;
  ON_Curve *local_d8;
  ON_Curve *pSeg_1;
  bool rc;
  double dStack_c8;
  double dStack_c0;
  double local_b8;
  double local_a8;
  double dStack_a0;
  double local_98;
  ON_3dPoint local_88;
  int local_70;
  int i;
  ON_3dPoint local_60;
  undefined1 local_48 [8];
  ON_3dPointArray Points;
  ON_Curve *pSeg;
  ON_3dPoint *P1_local;
  ON_3dPoint *P0_local;
  ON_PolyCurve *crv_local;
  
  iVar2 = ON_PolyCurve::Count(crv);
  if (iVar2 == 1) {
    Points.super_ON_SimpleArray<ON_3dPoint>._16_8_ = ON_PolyCurve::SegmentCurve(crv,0);
    if ((ON_Curve *)Points.super_ON_SimpleArray<ON_3dPoint>._16_8_ == (ON_Curve *)0x0) {
      crv_local._7_1_ = false;
    }
    else {
      crv_local._7_1_ =
           AdjustCurve((ON_Curve *)Points.super_ON_SimpleArray<ON_3dPoint>._16_8_,P0,P1);
    }
  }
  else {
    iVar2 = ON_PolyCurve::Count(crv);
    ON_3dPointArray::ON_3dPointArray((ON_3dPointArray *)local_48,iVar2 + 1);
    ON_Curve::PointAtStart(&local_60,&crv->super_ON_Curve);
    ON_SimpleArray<ON_3dPoint>::Append((ON_SimpleArray<ON_3dPoint> *)local_48,&local_60);
    for (local_70 = 0; iVar2 = local_70, iVar3 = ON_PolyCurve::Count(crv), iVar2 < iVar3;
        local_70 = local_70 + 1) {
      pOVar5 = ON_PolyCurve::SegmentCurve(crv,local_70);
      ON_Curve::PointAtEnd(&local_88,pOVar5);
      ON_SimpleArray<ON_3dPoint>::Append((ON_SimpleArray<ON_3dPoint> *)local_48,&local_88);
    }
    bVar1 = AdjustPointListAlongChord((ON_3dPointArray *)local_48,P0,P1);
    if (bVar1) {
      pSeg_1._3_1_ = 0;
      for (local_70 = 0; iVar2 = local_70, iVar3 = ON_PolyCurve::Count(crv), iVar2 < iVar3;
          local_70 = local_70 + 1) {
        pOVar5 = ON_PolyCurve::SegmentCurve(crv,local_70);
        local_d8 = pOVar5;
        if (pOVar5 == (ON_Curve *)0x0) {
          crv_local._7_1_ = (bool)(pSeg_1._3_1_ & 1);
          goto LAB_0054b4f1;
        }
        pOVar6 = ON_SimpleArray<ON_3dPoint>::operator[]
                           ((ON_SimpleArray<ON_3dPoint> *)local_48,local_70);
        P1_00 = ON_SimpleArray<ON_3dPoint>::operator[]
                          ((ON_SimpleArray<ON_3dPoint> *)local_48,local_70 + 1);
        bVar1 = AdjustCurve(pOVar5,pOVar6,P1_00);
        if (bVar1) {
          pSeg_1._3_1_ = 1;
        }
        ON_Curve::PointAtEnd(&local_f0,local_d8);
        pOVar6 = ON_SimpleArray<ON_3dPoint>::operator[]
                           ((ON_SimpleArray<ON_3dPoint> *)local_48,local_70 + 1);
        pOVar6->x = local_f0.x;
        pOVar6->y = local_f0.y;
        pOVar6->z = local_f0.z;
      }
      crv_local._7_1_ = (bool)(pSeg_1._3_1_ & 1);
    }
    else {
      local_98 = P0->z;
      local_a8 = P0->x;
      dStack_a0 = P0->y;
      uVar4 = (*(crv->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x39])();
      local_103 = 1;
      if ((uVar4 & 1) == 0) {
        local_b8 = P1->z;
        dStack_c8 = P1->x;
        dStack_c0 = P1->y;
        iVar2 = (*(crv->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x3a])();
        local_103 = (byte)iVar2;
      }
      crv_local._7_1_ = (bool)(-(local_103 & 1) & 1);
    }
LAB_0054b4f1:
    pSeg_1._4_4_ = 1;
    ON_3dPointArray::~ON_3dPointArray((ON_3dPointArray *)local_48);
  }
  return crv_local._7_1_;
}

Assistant:

static bool AdjustPolyCurve(ON_PolyCurve& crv,
                             const ON_3dPoint& P0, 
                             const ON_3dPoint& P1)

{
  if (crv.Count() == 1){
    ON_Curve* pSeg = crv.SegmentCurve(0);
    if (!pSeg)
      return false;
    return AdjustCurve(*pSeg, P0, P1);
  }

  ON_3dPointArray Points(crv.Count() + 1);
  Points.Append(crv.PointAtStart());

  int i;
  for (i=0; i<crv.Count(); i++)
    Points.Append(crv.SegmentCurve(i)->PointAtEnd());

  if (!AdjustPointListAlongChord(Points, P0, P1)){
    return (crv.SetStartPoint(P0) || crv.SetEndPoint(P1)) ? true : false;
  }

  bool rc = false;
  for (i=0; i<crv.Count(); i++){
    ON_Curve* pSeg = crv.SegmentCurve(i);
    if (!pSeg)
      return rc;
    if (AdjustCurve(*pSeg, Points[i], Points[i+1]))
      rc = true;
    Points[i+1] = pSeg->PointAtEnd();
  }

  return rc;
}